

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix.cc
# Opt level: O2

int __thiscall fmt::BufferedFile::close(BufferedFile *this,int __fd)

{
  int in_EAX;
  SystemError *this_00;
  int *piVar1;
  
  if ((FILE *)this->file_ != (FILE *)0x0) {
    in_EAX = fclose((FILE *)this->file_);
    this->file_ = (FILE *)0x0;
    if (in_EAX != 0) {
      this_00 = (SystemError *)__cxa_allocate_exception(0x18);
      piVar1 = __errno_location();
      SystemError::SystemError(this_00,*piVar1,(CStringRef)0x12e189);
      __cxa_throw(this_00,&SystemError::typeinfo,SystemError::~SystemError);
    }
  }
  return in_EAX;
}

Assistant:

void fmt::BufferedFile::close() {
  if (!file_)
    return;
  int result = FMT_SYSTEM(fclose(file_));
  file_ = 0;
  if (result != 0)
    FMT_THROW(SystemError(errno, "cannot close file"));
}